

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall Fl_Text_Display::offset_line_starts(Fl_Text_Display *this,int newTopLineNum)

{
  int iVar1;
  int oldFirstChar;
  uint uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint endLine;
  uint uVar7;
  uint uVar8;
  long lVar9;
  
  iVar1 = this->mTopLineNum;
  uVar7 = newTopLineNum - iVar1;
  if (uVar7 == 0) {
    return;
  }
  oldFirstChar = this->mFirstChar;
  uVar2 = this->mNVisibleLines;
  lVar9 = (long)(int)uVar2;
  piVar3 = this->mLineStarts;
  endLine = -uVar7;
  if (newTopLineNum < (int)endLine && newTopLineNum < iVar1) {
    iVar4 = newTopLineNum + -1;
    iVar5 = 0;
LAB_001d4e5f:
    iVar4 = skip_lines(this,iVar5,iVar4,true);
  }
  else {
    uVar8 = endLine;
    iVar4 = oldFirstChar;
    if (iVar1 <= newTopLineNum) {
      iVar5 = uVar2 + iVar1 + -1;
      iVar4 = newTopLineNum - iVar5;
      if (newTopLineNum < iVar5) {
        iVar4 = piVar3[(int)uVar7];
        goto LAB_001d4e96;
      }
      iVar5 = this->mNBufferLines - newTopLineNum;
      if (iVar4 < iVar5) {
        iVar5 = piVar3[lVar9 + -1];
        goto LAB_001d4e5f;
      }
      uVar8 = iVar5 + 1;
      iVar4 = this->mBuffer->mLength;
    }
    iVar4 = rewind_lines(this,iVar4,uVar8);
  }
LAB_001d4e96:
  this->mFirstChar = iVar4;
  if ((int)uVar7 < 0) {
    if ((int)endLine < (int)uVar2) {
      do {
        piVar3[lVar9 + -1] = piVar3[((long)newTopLineNum + lVar9 + -1) - (long)iVar1];
        lVar9 = lVar9 + -1;
      } while ((long)(ulong)endLine < lVar9);
      uVar8 = 0;
      goto LAB_001d4f1d;
    }
  }
  else if ((int)uVar7 < (int)uVar2) {
    endLine = uVar2 - 1;
    uVar8 = uVar2 - uVar7;
    if (uVar8 != 0 && (int)uVar7 <= (int)uVar2) {
      uVar6 = 0;
      do {
        piVar3[uVar6] = piVar3[uVar7 + uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    goto LAB_001d4f1d;
  }
  uVar8 = 0;
  endLine = uVar2;
LAB_001d4f1d:
  calc_line_starts(this,uVar8,endLine);
  calc_last_char(this);
  this->mTopLineNum = newTopLineNum;
  absolute_top_line_number(this,oldFirstChar);
  return;
}

Assistant:

void Fl_Text_Display::offset_line_starts( int newTopLineNum ) {
  int oldTopLineNum = mTopLineNum;
  int oldFirstChar = mFirstChar;
  int lineDelta = newTopLineNum - oldTopLineNum;
  int nVisLines = mNVisibleLines;
  int *lineStarts = mLineStarts;
  int i, lastLineNum;
  Fl_Text_Buffer *buf = mBuffer;

  /* If there was no offset, nothing needs to be changed */
  if ( lineDelta == 0 )
    return;

  /* Find the new value for mFirstChar by counting lines from the nearest
   known line start (start or end of buffer, or the closest value in the
   lineStarts array) */
  lastLineNum = oldTopLineNum + nVisLines - 1;
  if ( newTopLineNum < oldTopLineNum && newTopLineNum < -lineDelta ) {
    mFirstChar = skip_lines( 0, newTopLineNum - 1, true );
  } else if ( newTopLineNum < oldTopLineNum ) {
    mFirstChar = rewind_lines( mFirstChar, -lineDelta );
  } else if ( newTopLineNum < lastLineNum ) {
    mFirstChar = lineStarts[ newTopLineNum - oldTopLineNum ];
  } else if ( newTopLineNum - lastLineNum < mNBufferLines - newTopLineNum ) {
    mFirstChar = skip_lines( lineStarts[ nVisLines - 1 ],
                            newTopLineNum - lastLineNum, true );
  } else {
    mFirstChar = rewind_lines( buf->length(), mNBufferLines - newTopLineNum + 1 );
  }

  /* Fill in the line starts array */
  if ( lineDelta < 0 && -lineDelta < nVisLines ) {
    for ( i = nVisLines - 1; i >= -lineDelta; i-- )
      lineStarts[ i ] = lineStarts[ i + lineDelta ];
    calc_line_starts( 0, -lineDelta );
  } else if ( lineDelta > 0 && lineDelta < nVisLines ) {
    for ( i = 0; i < nVisLines - lineDelta; i++ )
      lineStarts[ i ] = lineStarts[ i + lineDelta ];
    calc_line_starts( nVisLines - lineDelta, nVisLines - 1 );
  } else
    calc_line_starts( 0, nVisLines );

  /* Set lastChar and mTopLineNum */
  calc_last_char();
  mTopLineNum = newTopLineNum;

  /* If we're numbering lines or being asked to maintain an absolute line
   number, re-calculate the absolute line number */
  absolute_top_line_number(oldFirstChar);
}